

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

String * kj::operator*(String *__return_storage_ptr__,Exception *param_2,undefined8 param_3,
                      int *param_4)

{
  bool bVar1;
  Context *pCVar2;
  String *this;
  size_t sVar3;
  size_t extraout_RDX;
  ulong index;
  ArrayPtr<const_char> AVar4;
  ArrayPtr<void_*const> AVar5;
  StringPtr filename;
  char (*in_stack_fffffffffffffd50) [2];
  String local_198;
  ArrayPtr<void_*const> local_180;
  String local_170;
  ArrayPtr<void_*const> local_158;
  undefined1 local_148 [24];
  ArrayPtr<const_char> local_130;
  undefined1 local_120 [24];
  ArrayPtr<const_char> local_108;
  char *local_f8;
  Type local_f0;
  int local_ec;
  undefined1 local_e8 [8];
  String local_e0;
  Maybe<const_kj::Exception::Context_&> local_c8;
  StringPtr local_c0;
  ArrayPtr<const_char> local_b0;
  String local_a0;
  Context *local_88;
  Context *c_1;
  Context *_c926;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  Array<kj::String> contextText;
  Context *c;
  Context *_c913;
  Maybe<const_kj::Exception::Context_&> contextPtr;
  uint contextDepth;
  Exception *e_local;
  
  contextPtr.ptr._4_4_ = 0;
  Exception::getContext((Exception *)&_c913);
  while( true ) {
    pCVar2 = _::readMaybe<kj::Exception::Context_const>
                       ((Maybe<const_kj::Exception::Context_&> *)&_c913);
    if (pCVar2 == (Context *)0x0) break;
    contextPtr.ptr._4_4_ = contextPtr.ptr._4_4_ + 1;
    Maybe::operator_cast_to_Type((Maybe *)&contextText.disposer);
    Maybe<const_kj::Exception::Context_&>::operator=
              ((Maybe<const_kj::Exception::Context_&> *)&_c913,
               (Maybe<const_kj::Exception::Context_&> *)&contextText.disposer);
  }
  heapArray<kj::String>((Array<kj::String> *)local_60,(ulong)contextPtr.ptr._4_4_);
  contextPtr.ptr._4_4_ = 0;
  Exception::getContext((Exception *)local_68);
  Maybe<const_kj::Exception::Context_&>::operator=
            ((Maybe<const_kj::Exception::Context_&> *)&_c913,
             (Maybe<const_kj::Exception::Context_&> *)local_68);
  while( true ) {
    c_1 = _::readMaybe<kj::Exception::Context_const>
                    ((Maybe<const_kj::Exception::Context_&> *)&_c913);
    if (c_1 == (Context *)0x0) break;
    local_88 = c_1;
    StringPtr::StringPtr(&local_c0,c_1->file);
    filename.content.size_ = extraout_RDX;
    filename.content.ptr = (char *)local_c0.content.size_;
    AVar4 = (ArrayPtr<const_char>)trimSourceFilename((kj *)local_c0.content.ptr,filename);
    param_4 = &local_88->line;
    local_b0 = AVar4;
    str<kj::StringPtr,char_const(&)[2],int_const&,char_const(&)[12],kj::String_const&,char_const(&)[2]>
              (&local_a0,(kj *)&local_b0,(StringPtr *)0x227126,(char (*) [2])param_4,
               (int *)": context: ",(char (*) [12])&local_88->description,(String *)0x23b62d,
               in_stack_fffffffffffffd50);
    index = (ulong)contextPtr.ptr._4_4_;
    contextPtr.ptr._4_4_ = contextPtr.ptr._4_4_ + 1;
    this = Array<kj::String>::operator[]((Array<kj::String> *)local_60,index);
    String::operator=(this,&local_a0);
    String::~String(&local_a0);
    Maybe::operator_cast_to_Type((Maybe *)&local_c8);
    Maybe<const_kj::Exception::Context_&>::operator=
              ((Maybe<const_kj::Exception::Context_&> *)&_c913,&local_c8);
  }
  strArray<kj::Array<kj::String>&>
            (&local_e0,(kj *)local_60,(Array<kj::String> *)0x23b62e,(char *)param_4);
  local_e8 = (undefined1  [8])Exception::getFile(param_2);
  local_ec = Exception::getLine(param_2);
  local_f0 = Exception::getType(param_2);
  local_108 = (ArrayPtr<const_char>)Exception::getDescription(param_2);
  bVar1 = StringPtr::operator==((StringPtr *)&local_108,(void *)0x0);
  local_f8 = ": ";
  if (bVar1) {
    local_f8 = "";
  }
  local_120._8_16_ = (undefined1  [16])Exception::getDescription(param_2);
  local_130 = (ArrayPtr<const_char>)Exception::getRemoteTrace(param_2);
  sVar3 = StringPtr::size((StringPtr *)&local_130);
  local_120._0_8_ = "";
  if (sVar3 != 0) {
    local_120._0_8_ = "\nremote: ";
  }
  local_148._8_16_ = (undefined1  [16])Exception::getRemoteTrace(param_2);
  local_158 = Exception::getStackTrace(param_2);
  sVar3 = ArrayPtr<void_*const>::size(&local_158);
  local_148._0_8_ = "";
  if (sVar3 != 0) {
    local_148._0_8_ = "\nstack: ";
  }
  local_180 = Exception::getStackTrace(param_2);
  AVar5.ptr = (void **)local_180.size_;
  AVar5.size_ = (size_t)local_180.ptr;
  stringifyStackTraceAddresses(&local_170,(kj *)local_180.ptr,AVar5);
  AVar5 = Exception::getStackTrace(param_2);
  stringifyStackTrace(&local_198,AVar5);
  str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
            (__return_storage_ptr__,(kj *)&local_e0,(String *)local_e8,(char **)0x227126,
             (char (*) [2])&local_ec,(int *)0x239571,(char (*) [3])&local_f0,(Type *)&local_f8,
             (char **)(local_120 + 8),(StringPtr *)local_120,(char **)(local_148 + 8),
             (StringPtr *)local_148,(char **)&local_170,&local_198,
             (String *)&stack0xfffffffffffffd48);
  String::~String(&local_198);
  String::~String(&local_170);
  String::~String(&local_e0);
  Array<kj::String>::~Array((Array<kj::String> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(const Exception& e) {
  uint contextDepth = 0;

  Maybe<const Exception::Context&> contextPtr = e.getContext();
  for (;;) {
    KJ_IF_SOME(c, contextPtr) {
      ++contextDepth;
      contextPtr = c.next;
    } else {
      break;
    }
  }